

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord2d *value)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_30 [8];
  double2 v;
  texcoord2d *value_local;
  AsciiParser *this_local;
  
  v._M_elems[1] = (double)value;
  bVar1 = ParseBasicTypeTuple<double,2ul>(this,(array<double,_2UL> *)local_30);
  if (bVar1) {
    pvVar2 = ::std::array<double,_2UL>::operator[]((array<double,_2UL> *)local_30,0);
    *(value_type_conflict2 *)v._M_elems[1] = *pvVar2;
    pvVar2 = ::std::array<double,_2UL>::operator[]((array<double,_2UL> *)local_30,1);
    *(value_type_conflict2 *)((long)v._M_elems[1] + 8) = *pvVar2;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord2d *value) {
  value::double2 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = v[0];
    value->t = v[1];
    return true;
  }
  return false;
}